

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pools.cpp
# Opt level: O3

void __thiscall xmrig::Pools::load(Pools *this,IJsonReader *reader)

{
  pointer pPVar1;
  pointer pPVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  Value *object;
  pointer this_00;
  Pool pool;
  Pool PStack_e8;
  uint *puVar4;
  
  pPVar1 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      Pool::~Pool(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pPVar2);
    (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar1;
  }
  iVar3 = (*reader->_vptr_IJsonReader[5])(reader,"pools");
  puVar4 = (uint *)CONCAT44(extraout_var,iVar3);
  if (*(short *)((long)puVar4 + 0xe) == 4) {
    if ((ulong)*puVar4 != 0) {
      object = (Value *)(*(ulong *)(puVar4 + 2) & 0xffffffffffff);
      lVar5 = (ulong)*puVar4 << 4;
      do {
        if ((object->data_).f.flags == 3) {
          Pool::Pool(&PStack_e8,object);
          if ((PStack_e8.m_url.m_host.m_data != (char *)0x0) && (PStack_e8.m_url.m_port != 0)) {
            std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::emplace_back<xmrig::Pool>
                      (&this->m_data,&PStack_e8);
          }
          Pool::~Pool(&PStack_e8);
        }
        object = object + 1;
        lVar5 = lVar5 + -0x10;
      } while (lVar5 != 0);
    }
    iVar3 = (*reader->_vptr_IJsonReader[8])(reader,"retries",0);
    if (iVar3 - 1U < 1000) {
      this->m_retries = iVar3;
    }
    iVar3 = (*reader->_vptr_IJsonReader[8])(reader,"retry-pause",0);
    if (iVar3 - 1U < 0xe10) {
      this->m_retryPause = iVar3;
    }
  }
  return;
}

Assistant:

void xmrig::Pools::load(const IJsonReader &reader)
{
    m_data.clear();

    const rapidjson::Value &pools = reader.getArray("pools");
    if (!pools.IsArray()) {
        return;
    }

    for (const rapidjson::Value &value : pools.GetArray()) {
        if (!value.IsObject()) {
            continue;
        }

        Pool pool(value);
        if (pool.isValid()) {
            m_data.push_back(std::move(pool));
        }
    }

    setRetries(reader.getInt("retries"));
    setRetryPause(reader.getInt("retry-pause"));
}